

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O0

int cmfgkb_(int *lot,int *ido,int *ip,int *l1,int *lid,int *na,double *cc,double *cc1,int *im1,
           int *in1,double *ch,double *ch1,int *im2,int *in2,double *wa)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  bool bVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  int *in_RCX;
  long lVar27;
  int iVar28;
  int *in_RDX;
  int *in_RSI;
  int *in_RDI;
  int *in_R8;
  int *in_R9;
  int l;
  int k;
  int j;
  int i__;
  int i__5;
  int i__4;
  int i__3;
  int i__2;
  int i__1;
  int wa_offset;
  int wa_dim2;
  int wa_dim1;
  int ch1_offset;
  int ch1_dim3;
  int ch1_dim2;
  int cc1_offset;
  int cc1_dim3;
  int cc1_dim2;
  int cc_offset;
  int cc_dim4;
  int cc_dim3;
  int cc_dim2;
  int ch_offset;
  int ch_dim4;
  int ch_dim3;
  int ch_dim2;
  undefined4 local_b4;
  undefined4 local_a8;
  undefined4 local_a4;
  undefined4 local_a0;
  undefined4 local_9c;
  undefined4 local_98;
  undefined4 local_94;
  double chold2;
  double chold1;
  int ipph;
  int idlj;
  int ipp2;
  double war;
  double wai;
  int m2s;
  int m1d;
  int ki;
  int lc;
  int jc;
  int m2;
  int m1;
  
  iVar3 = *in_RSI;
  iVar15 = *in_RDX + -1;
  lVar22 = _cc_offset + (long)(iVar3 * *in_RDX + 1) * -8;
  iVar4 = *_i__1;
  iVar5 = *in_R8;
  lVar23 = _i__5 + (long)((iVar4 * (iVar5 + 1) + 1) * 2 + 1) * -8;
  iVar21 = *_i__1;
  iVar6 = *in_RCX;
  iVar7 = *in_RDX;
  lVar24 = _j + (long)((iVar21 * (iVar6 * (iVar7 + 1) + 1) + 1) * 2 + 1) * -8;
  iVar8 = *_cc1_dim3;
  iVar9 = *in_R8;
  lVar25 = _ch1_offset + (long)((iVar8 * (iVar9 + 1) + 1) * 2 + 1) * -8;
  iVar10 = *_cc1_dim3;
  iVar11 = *in_RCX;
  iVar12 = *in_RSI;
  lVar26 = _wa_dim2 + (long)((iVar10 * (iVar11 * (iVar12 + 1) + 1) + 1) * 2 + 1) * -8;
  iVar16 = (*in_RDI + -1) * *_i__3 + 1;
  iVar17 = 1 - *_ch1_dim2;
  iVar18 = *in_RDX + 2;
  iVar19 = (*in_RDX + 1) / 2;
  iVar28 = *in_R8;
  for (local_b4 = 1; local_b4 <= iVar28; local_b4 = local_b4 + 1) {
    iVar20 = *_i__3;
    local_a4 = 1;
    local_a8 = iVar17;
    while( true ) {
      if (iVar20 < 0) {
        bVar14 = iVar16 <= local_a4;
      }
      else {
        bVar14 = local_a4 <= iVar16;
      }
      if (!bVar14) break;
      local_a8 = *_ch1_dim2 + local_a8;
      *(undefined8 *)(lVar25 + (long)((local_a8 + (local_b4 + iVar9) * iVar8) * 2 + 1) * 8) =
           *(undefined8 *)(lVar23 + (long)((local_a4 + (local_b4 + iVar5) * iVar4) * 2 + 1) * 8);
      *(undefined8 *)(lVar25 + (long)((local_a8 + (local_b4 + iVar9) * iVar8) * 2 + 2) * 8) =
           *(undefined8 *)(lVar23 + (long)((local_a4 + (local_b4 + iVar5) * iVar4) * 2 + 2) * 8);
      local_a4 = iVar20 + local_a4;
    }
  }
  for (local_98 = 2; local_98 <= iVar19; local_98 = local_98 + 1) {
    iVar20 = iVar18 - local_98;
    iVar28 = *in_R8;
    for (local_b4 = 1; local_b4 <= iVar28; local_b4 = local_b4 + 1) {
      iVar13 = *_i__3;
      local_a4 = 1;
      local_a8 = iVar17;
      while( true ) {
        if (iVar13 < 0) {
          bVar14 = iVar16 <= local_a4;
        }
        else {
          bVar14 = local_a4 <= iVar16;
        }
        if (!bVar14) break;
        local_a8 = *_ch1_dim2 + local_a8;
        *(double *)(lVar25 + (long)((local_a8 + (local_b4 + local_98 * iVar9) * iVar8) * 2 + 1) * 8)
             = *(double *)
                (lVar23 + (long)((local_a4 + (local_b4 + local_98 * iVar5) * iVar4) * 2 + 1) * 8) +
               *(double *)
                (lVar23 + (long)((local_a4 + (local_b4 + iVar20 * iVar5) * iVar4) * 2 + 1) * 8);
        *(double *)(lVar25 + (long)((local_a8 + (local_b4 + iVar20 * iVar9) * iVar8) * 2 + 1) * 8) =
             *(double *)
              (lVar23 + (long)((local_a4 + (local_b4 + local_98 * iVar5) * iVar4) * 2 + 1) * 8) -
             *(double *)
              (lVar23 + (long)((local_a4 + (local_b4 + iVar20 * iVar5) * iVar4) * 2 + 1) * 8);
        *(double *)(lVar25 + (long)((local_a8 + (local_b4 + local_98 * iVar9) * iVar8) * 2 + 2) * 8)
             = *(double *)
                (lVar23 + (long)((local_a4 + (local_b4 + local_98 * iVar5) * iVar4) * 2 + 2) * 8) +
               *(double *)
                (lVar23 + (long)((local_a4 + (local_b4 + iVar20 * iVar5) * iVar4) * 2 + 2) * 8);
        *(double *)(lVar25 + (long)((local_a8 + (local_b4 + iVar20 * iVar9) * iVar8) * 2 + 2) * 8) =
             *(double *)
              (lVar23 + (long)((local_a4 + (local_b4 + local_98 * iVar5) * iVar4) * 2 + 2) * 8) -
             *(double *)
              (lVar23 + (long)((local_a4 + (local_b4 + iVar20 * iVar5) * iVar4) * 2 + 2) * 8);
        local_a4 = iVar13 + local_a4;
      }
    }
  }
  for (local_98 = 2; local_98 <= iVar19; local_98 = local_98 + 1) {
    iVar28 = *in_R8;
    for (local_b4 = 1; local_b4 <= iVar28; local_b4 = local_b4 + 1) {
      iVar20 = *_i__3;
      local_a4 = 1;
      local_a8 = iVar17;
      while( true ) {
        if (iVar20 < 0) {
          bVar14 = iVar16 <= local_a4;
        }
        else {
          bVar14 = local_a4 <= iVar16;
        }
        if (!bVar14) break;
        local_a8 = *_ch1_dim2 + local_a8;
        lVar27 = (long)((local_a4 + (local_b4 + iVar5) * iVar4) * 2 + 1);
        *(double *)(lVar23 + lVar27 * 8) =
             *(double *)
              (lVar25 + (long)((local_a8 + (local_b4 + local_98 * iVar9) * iVar8) * 2 + 1) * 8) +
             *(double *)(lVar23 + lVar27 * 8);
        lVar27 = (long)((local_a4 + (local_b4 + iVar5) * iVar4) * 2 + 2);
        *(double *)(lVar23 + lVar27 * 8) =
             *(double *)
              (lVar25 + (long)((local_a8 + (local_b4 + local_98 * iVar9) * iVar8) * 2 + 2) * 8) +
             *(double *)(lVar23 + lVar27 * 8);
        local_a4 = iVar20 + local_a4;
      }
    }
  }
  for (local_a0 = 2; local_a0 <= iVar19; local_a0 = local_a0 + 1) {
    iVar20 = iVar18 - local_a0;
    iVar28 = *in_R8;
    for (local_b4 = 1; local_b4 <= iVar28; local_b4 = local_b4 + 1) {
      iVar13 = *_i__3;
      local_a4 = 1;
      local_a8 = iVar17;
      while( true ) {
        if (iVar13 < 0) {
          bVar14 = iVar16 <= local_a4;
        }
        else {
          bVar14 = local_a4 <= iVar16;
        }
        if (!bVar14) break;
        local_a8 = *_ch1_dim2 + local_a8;
        *(double *)(lVar23 + (long)((local_a4 + (local_b4 + local_a0 * iVar5) * iVar4) * 2 + 1) * 8)
             = *(double *)(lVar22 + (long)((local_a0 + -1 + iVar15) * iVar3 + 1) * 8) *
               *(double *)(lVar25 + (long)((local_a8 + (local_b4 + iVar9 * 2) * iVar8) * 2 + 1) * 8)
               + *(double *)(lVar25 + (long)((local_a8 + (local_b4 + iVar9) * iVar8) * 2 + 1) * 8);
        *(double *)(lVar23 + (long)((local_a4 + (local_b4 + iVar20 * iVar5) * iVar4) * 2 + 1) * 8) =
             *(double *)(lVar22 + (long)((local_a0 + -1 + iVar15 * 2) * iVar3 + 1) * 8) *
             *(double *)
              (lVar25 + (long)((local_a8 + (local_b4 + *in_RDX * iVar9) * iVar8) * 2 + 1) * 8);
        *(double *)(lVar23 + (long)((local_a4 + (local_b4 + local_a0 * iVar5) * iVar4) * 2 + 2) * 8)
             = *(double *)(lVar22 + (long)((local_a0 + -1 + iVar15) * iVar3 + 1) * 8) *
               *(double *)(lVar25 + (long)((local_a8 + (local_b4 + iVar9 * 2) * iVar8) * 2 + 2) * 8)
               + *(double *)(lVar25 + (long)((local_a8 + (local_b4 + iVar9) * iVar8) * 2 + 2) * 8);
        *(double *)(lVar23 + (long)((local_a4 + (local_b4 + iVar20 * iVar5) * iVar4) * 2 + 2) * 8) =
             *(double *)(lVar22 + (long)((local_a0 + -1 + iVar15 * 2) * iVar3 + 1) * 8) *
             *(double *)
              (lVar25 + (long)((local_a8 + (local_b4 + *in_RDX * iVar9) * iVar8) * 2 + 2) * 8);
        local_a4 = iVar13 + local_a4;
      }
    }
    for (local_98 = 3; local_98 <= iVar19; local_98 = local_98 + 1) {
      iVar28 = ((local_a0 + -1) * (local_98 + -1)) % *in_RDX;
      dVar1 = *(double *)(lVar22 + (long)((iVar28 + iVar15) * iVar3 + 1) * 8);
      dVar2 = *(double *)(lVar22 + (long)((iVar28 + iVar15 * 2) * iVar3 + 1) * 8);
      iVar28 = *in_R8;
      for (local_b4 = 1; local_b4 <= iVar28; local_b4 = local_b4 + 1) {
        iVar13 = *_i__3;
        local_a4 = 1;
        local_a8 = iVar17;
        while( true ) {
          if (iVar13 < 0) {
            bVar14 = iVar16 <= local_a4;
          }
          else {
            bVar14 = local_a4 <= iVar16;
          }
          if (!bVar14) break;
          local_a8 = *_ch1_dim2 + local_a8;
          lVar27 = (long)((local_a4 + (local_b4 + local_a0 * iVar5) * iVar4) * 2 + 1);
          *(double *)(lVar23 + lVar27 * 8) =
               dVar1 * *(double *)
                        (lVar25 + (long)((local_a8 + (local_b4 + local_98 * iVar9) * iVar8) * 2 + 1)
                                  * 8) + *(double *)(lVar23 + lVar27 * 8);
          lVar27 = (long)((local_a4 + (local_b4 + iVar20 * iVar5) * iVar4) * 2 + 1);
          *(double *)(lVar23 + lVar27 * 8) =
               dVar2 * *(double *)
                        (lVar25 + (long)((local_a8 +
                                         (local_b4 + (iVar18 - local_98) * iVar9) * iVar8) * 2 + 1)
                                  * 8) + *(double *)(lVar23 + lVar27 * 8);
          lVar27 = (long)((local_a4 + (local_b4 + local_a0 * iVar5) * iVar4) * 2 + 2);
          *(double *)(lVar23 + lVar27 * 8) =
               dVar1 * *(double *)
                        (lVar25 + (long)((local_a8 + (local_b4 + local_98 * iVar9) * iVar8) * 2 + 2)
                                  * 8) + *(double *)(lVar23 + lVar27 * 8);
          lVar27 = (long)((local_a4 + (local_b4 + iVar20 * iVar5) * iVar4) * 2 + 2);
          *(double *)(lVar23 + lVar27 * 8) =
               dVar2 * *(double *)
                        (lVar25 + (long)((local_a8 +
                                         (local_b4 + (iVar18 - local_98) * iVar9) * iVar8) * 2 + 2)
                                  * 8) + *(double *)(lVar23 + lVar27 * 8);
          local_a4 = iVar13 + local_a4;
        }
      }
    }
  }
  if ((*in_RSI < 2) && (*in_R9 != 1)) {
    for (local_98 = 2; local_98 <= iVar19; local_98 = local_98 + 1) {
      iVar21 = iVar18 - local_98;
      iVar3 = *in_R8;
      for (local_b4 = 1; local_b4 <= iVar3; local_b4 = local_b4 + 1) {
        iVar6 = *_i__3;
        local_a4 = 1;
        while( true ) {
          if (iVar6 < 0) {
            bVar14 = iVar16 <= local_a4;
          }
          else {
            bVar14 = local_a4 <= iVar16;
          }
          if (!bVar14) break;
          dVar1 = *(double *)
                   (lVar23 + (long)((local_a4 + (local_b4 + local_98 * iVar5) * iVar4) * 2 + 1) * 8)
          ;
          dVar2 = *(double *)
                   (lVar23 + (long)((local_a4 + (local_b4 + iVar21 * iVar5) * iVar4) * 2 + 2) * 8);
          *(double *)
           (lVar23 + (long)((local_a4 + (local_b4 + local_98 * iVar5) * iVar4) * 2 + 1) * 8) =
               *(double *)
                (lVar23 + (long)((local_a4 + (local_b4 + local_98 * iVar5) * iVar4) * 2 + 1) * 8) -
               *(double *)
                (lVar23 + (long)((local_a4 + (local_b4 + iVar21 * iVar5) * iVar4) * 2 + 2) * 8);
          *(double *)(lVar23 + (long)((local_a4 + (local_b4 + iVar21 * iVar5) * iVar4) * 2 + 2) * 8)
               = *(double *)
                  (lVar23 + (long)((local_a4 + (local_b4 + local_98 * iVar5) * iVar4) * 2 + 2) * 8)
                 - *(double *)
                    (lVar23 + (long)((local_a4 + (local_b4 + iVar21 * iVar5) * iVar4) * 2 + 1) * 8);
          lVar22 = (long)((local_a4 + (local_b4 + local_98 * iVar5) * iVar4) * 2 + 2);
          *(double *)(lVar23 + lVar22 * 8) =
               *(double *)
                (lVar23 + (long)((local_a4 + (local_b4 + iVar21 * iVar5) * iVar4) * 2 + 1) * 8) +
               *(double *)(lVar23 + lVar22 * 8);
          *(double *)(lVar23 + (long)((local_a4 + (local_b4 + iVar21 * iVar5) * iVar4) * 2 + 1) * 8)
               = dVar1 + dVar2;
          local_a4 = iVar6 + local_a4;
        }
      }
    }
  }
  else {
    iVar28 = *in_R8;
    for (local_b4 = 1; local_b4 <= iVar28; local_b4 = local_b4 + 1) {
      iVar20 = *_i__3;
      local_a4 = 1;
      local_a8 = iVar17;
      while( true ) {
        if (iVar20 < 0) {
          bVar14 = iVar16 <= local_a4;
        }
        else {
          bVar14 = local_a4 <= iVar16;
        }
        if (!bVar14) break;
        local_a8 = *_ch1_dim2 + local_a8;
        *(undefined8 *)(lVar25 + (long)((local_a8 + (local_b4 + iVar9) * iVar8) * 2 + 1) * 8) =
             *(undefined8 *)(lVar23 + (long)((local_a4 + (local_b4 + iVar5) * iVar4) * 2 + 1) * 8);
        *(undefined8 *)(lVar25 + (long)((local_a8 + (local_b4 + iVar9) * iVar8) * 2 + 2) * 8) =
             *(undefined8 *)(lVar23 + (long)((local_a4 + (local_b4 + iVar5) * iVar4) * 2 + 2) * 8);
        local_a4 = iVar20 + local_a4;
      }
    }
    for (local_98 = 2; local_98 <= iVar19; local_98 = local_98 + 1) {
      iVar20 = iVar18 - local_98;
      iVar28 = *in_R8;
      for (local_b4 = 1; local_b4 <= iVar28; local_b4 = local_b4 + 1) {
        iVar13 = *_i__3;
        local_a4 = 1;
        local_a8 = iVar17;
        while( true ) {
          if (iVar13 < 0) {
            bVar14 = iVar16 <= local_a4;
          }
          else {
            bVar14 = local_a4 <= iVar16;
          }
          if (!bVar14) break;
          local_a8 = *_ch1_dim2 + local_a8;
          *(double *)
           (lVar25 + (long)((local_a8 + (local_b4 + local_98 * iVar9) * iVar8) * 2 + 1) * 8) =
               *(double *)
                (lVar23 + (long)((local_a4 + (local_b4 + local_98 * iVar5) * iVar4) * 2 + 1) * 8) -
               *(double *)
                (lVar23 + (long)((local_a4 + (local_b4 + iVar20 * iVar5) * iVar4) * 2 + 2) * 8);
          *(double *)(lVar25 + (long)((local_a8 + (local_b4 + iVar20 * iVar9) * iVar8) * 2 + 1) * 8)
               = *(double *)
                  (lVar23 + (long)((local_a4 + (local_b4 + local_98 * iVar5) * iVar4) * 2 + 1) * 8)
                 + *(double *)
                    (lVar23 + (long)((local_a4 + (local_b4 + iVar20 * iVar5) * iVar4) * 2 + 2) * 8);
          *(double *)(lVar25 + (long)((local_a8 + (local_b4 + iVar20 * iVar9) * iVar8) * 2 + 2) * 8)
               = *(double *)
                  (lVar23 + (long)((local_a4 + (local_b4 + local_98 * iVar5) * iVar4) * 2 + 2) * 8)
                 - *(double *)
                    (lVar23 + (long)((local_a4 + (local_b4 + iVar20 * iVar5) * iVar4) * 2 + 1) * 8);
          *(double *)
           (lVar25 + (long)((local_a8 + (local_b4 + local_98 * iVar9) * iVar8) * 2 + 2) * 8) =
               *(double *)
                (lVar23 + (long)((local_a4 + (local_b4 + local_98 * iVar5) * iVar4) * 2 + 2) * 8) +
               *(double *)
                (lVar23 + (long)((local_a4 + (local_b4 + iVar20 * iVar5) * iVar4) * 2 + 1) * 8);
          local_a4 = iVar13 + local_a4;
        }
      }
    }
    if (*in_RSI != 1) {
      iVar4 = *in_RSI;
      for (local_94 = 1; local_94 <= iVar4; local_94 = local_94 + 1) {
        iVar5 = *in_RCX;
        for (local_9c = 1; local_9c <= iVar5; local_9c = local_9c + 1) {
          iVar8 = *_i__3;
          local_a4 = 1;
          local_a8 = iVar17;
          while( true ) {
            if (iVar8 < 0) {
              bVar14 = iVar16 <= local_a4;
            }
            else {
              bVar14 = local_a4 <= iVar16;
            }
            if (!bVar14) break;
            local_a8 = *_ch1_dim2 + local_a8;
            *(undefined8 *)
             (lVar24 + (long)((local_a4 + (local_9c + (local_94 * iVar7 + 1) * iVar6) * iVar21) * 2
                             + 1) * 8) =
                 *(undefined8 *)
                  (lVar26 + (long)((local_a8 + (local_9c + (local_94 + iVar12) * iVar11) * iVar10) *
                                   2 + 1) * 8);
            *(undefined8 *)
             (lVar24 + (long)((local_a4 + (local_9c + (local_94 * iVar7 + 1) * iVar6) * iVar21) * 2
                             + 2) * 8) =
                 *(undefined8 *)
                  (lVar26 + (long)((local_a8 + (local_9c + (local_94 + iVar12) * iVar11) * iVar10) *
                                   2 + 2) * 8);
            local_a4 = iVar8 + local_a4;
          }
        }
      }
      iVar4 = *in_RDX;
      for (local_98 = 2; local_98 <= iVar4; local_98 = local_98 + 1) {
        iVar5 = *in_RCX;
        for (local_9c = 1; local_9c <= iVar5; local_9c = local_9c + 1) {
          iVar8 = *_i__3;
          local_a4 = 1;
          local_a8 = iVar17;
          while( true ) {
            if (iVar8 < 0) {
              bVar14 = iVar16 <= local_a4;
            }
            else {
              bVar14 = local_a4 <= iVar16;
            }
            if (!bVar14) break;
            local_a8 = *_ch1_dim2 + local_a8;
            *(undefined8 *)
             (lVar24 + (long)((local_a4 + (local_9c + (local_98 + iVar7) * iVar6) * iVar21) * 2 + 1)
                       * 8) =
                 *(undefined8 *)
                  (lVar26 + (long)((local_a8 +
                                   (local_9c + (local_98 * iVar12 + 1) * iVar11) * iVar10) * 2 + 1)
                            * 8);
            *(undefined8 *)
             (lVar24 + (long)((local_a4 + (local_9c + (local_98 + iVar7) * iVar6) * iVar21) * 2 + 2)
                       * 8) =
                 *(undefined8 *)
                  (lVar26 + (long)((local_a8 +
                                   (local_9c + (local_98 * iVar12 + 1) * iVar11) * iVar10) * 2 + 2)
                            * 8);
            local_a4 = iVar8 + local_a4;
          }
        }
      }
      iVar4 = *in_RDX;
      for (local_98 = 2; local_98 <= iVar4; local_98 = local_98 + 1) {
        iVar5 = *in_RSI;
        for (local_94 = 2; local_94 <= iVar5; local_94 = local_94 + 1) {
          iVar8 = *in_RCX;
          for (local_9c = 1; local_9c <= iVar8; local_9c = local_9c + 1) {
            iVar9 = *_i__3;
            local_a4 = 1;
            local_a8 = iVar17;
            while( true ) {
              if (iVar9 < 0) {
                bVar14 = iVar16 <= local_a4;
              }
              else {
                bVar14 = local_a4 <= iVar16;
              }
              if (!bVar14) break;
              local_a8 = *_ch1_dim2 + local_a8;
              *(double *)
               (lVar24 + (long)((local_a4 +
                                (local_9c + (local_98 + local_94 * iVar7) * iVar6) * iVar21) * 2 + 1
                               ) * 8) =
                   *(double *)(lVar22 + (long)(local_94 + (local_98 + -1 + iVar15) * iVar3) * 8) *
                   *(double *)
                    (lVar26 + (long)((local_a8 +
                                     (local_9c + (local_94 + local_98 * iVar12) * iVar11) * iVar10)
                                     * 2 + 1) * 8) +
                   -(*(double *)
                      (lVar22 + (long)(local_94 + (local_98 + -1 + iVar15 * 2) * iVar3) * 8) *
                    *(double *)
                     (lVar26 + (long)((local_a8 +
                                      (local_9c + (local_94 + local_98 * iVar12) * iVar11) * iVar10)
                                      * 2 + 2) * 8));
              *(double *)
               (lVar24 + (long)((local_a4 +
                                (local_9c + (local_98 + local_94 * iVar7) * iVar6) * iVar21) * 2 + 2
                               ) * 8) =
                   *(double *)(lVar22 + (long)(local_94 + (local_98 + -1 + iVar15) * iVar3) * 8) *
                   *(double *)
                    (lVar26 + (long)((local_a8 +
                                     (local_9c + (local_94 + local_98 * iVar12) * iVar11) * iVar10)
                                     * 2 + 2) * 8) +
                   *(double *)(lVar22 + (long)(local_94 + (local_98 + -1 + iVar15 * 2) * iVar3) * 8)
                   * *(double *)
                      (lVar26 + (long)((local_a8 +
                                       (local_9c + (local_94 + local_98 * iVar12) * iVar11) * iVar10
                                       ) * 2 + 1) * 8);
              local_a4 = iVar9 + local_a4;
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int cmfgkb_(int *lot, int *ido, int *ip, int
	*l1, int *lid, int *na, fft_real_t *cc, fft_real_t *cc1, int *im1,
	int *in1, fft_real_t *ch, fft_real_t *ch1, int *im2, int *in2, fft_real_t *
	wa)
{
    /* System generated locals */
    int ch_dim2, ch_dim3, ch_dim4, ch_offset, cc_dim2, cc_dim3, cc_dim4,
	    cc_offset, cc1_dim2, cc1_dim3, cc1_offset, ch1_dim2, ch1_dim3,
	    ch1_offset, wa_dim1, wa_dim2, wa_offset, i__1, i__2, i__3, i__4,
	    i__5;

    /* Local variables */
     int i__, j, k, l, m1, m2, jc, lc, ki, m1d, m2s;
     fft_real_t wai, war;
     int ipp2, idlj, ipph;
     fft_real_t chold1, chold2;


/* FFTPACK 5.0 auxiliary routine */

    /* Parameter adjustments */
    wa_dim1 = *ido;
    wa_dim2 = *ip - 1;
    wa_offset = 1 + wa_dim1 * (1 + wa_dim2);
    wa -= wa_offset;
    cc1_dim2 = *in1;
    cc1_dim3 = *lid;
    cc1_offset = 1 + 2 * (1 + cc1_dim2 * (1 + cc1_dim3));
    cc1 -= cc1_offset;
    cc_dim2 = *in1;
    cc_dim3 = *l1;
    cc_dim4 = *ip;
    cc_offset = 1 + 2 * (1 + cc_dim2 * (1 + cc_dim3 * (1 + cc_dim4)));
    cc -= cc_offset;
    ch1_dim2 = *in2;
    ch1_dim3 = *lid;
    ch1_offset = 1 + 2 * (1 + ch1_dim2 * (1 + ch1_dim3));
    ch1 -= ch1_offset;
    ch_dim2 = *in2;
    ch_dim3 = *l1;
    ch_dim4 = *ido;
    ch_offset = 1 + 2 * (1 + ch_dim2 * (1 + ch_dim3 * (1 + ch_dim4)));
    ch -= ch_offset;

    /* Function Body */
    m1d = (*lot - 1) * *im1 + 1;
    m2s = 1 - *im2;
    ipp2 = *ip + 2;
    ipph = (*ip + 1) / 2;
    i__1 = *lid;
    for (ki = 1; ki <= i__1; ++ki) {
	m2 = m2s;
	i__2 = m1d;
	i__3 = *im1;
	for (m1 = 1; i__3 < 0 ? m1 >= i__2 : m1 <= i__2; m1 += i__3) {
	    m2 += *im2;
	    ch1[(m2 + (ki + ch1_dim3) * ch1_dim2 << 1) + 1] = cc1[(m1 + (ki +
		    cc1_dim3) * cc1_dim2 << 1) + 1];
	    ch1[(m2 + (ki + ch1_dim3) * ch1_dim2 << 1) + 2] = cc1[(m1 + (ki +
		    cc1_dim3) * cc1_dim2 << 1) + 2];
/* L110: */
	}
    }
    i__3 = ipph;
    for (j = 2; j <= i__3; ++j) {
	jc = ipp2 - j;
	i__2 = *lid;
	for (ki = 1; ki <= i__2; ++ki) {
	    m2 = m2s;
	    i__1 = m1d;
	    i__4 = *im1;
	    for (m1 = 1; i__4 < 0 ? m1 >= i__1 : m1 <= i__1; m1 += i__4) {
		m2 += *im2;
		ch1[(m2 + (ki + j * ch1_dim3) * ch1_dim2 << 1) + 1] = cc1[(m1
			+ (ki + j * cc1_dim3) * cc1_dim2 << 1) + 1] + cc1[(m1
			+ (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 1];
		ch1[(m2 + (ki + jc * ch1_dim3) * ch1_dim2 << 1) + 1] = cc1[(
			m1 + (ki + j * cc1_dim3) * cc1_dim2 << 1) + 1] - cc1[(
			m1 + (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 1];
		ch1[(m2 + (ki + j * ch1_dim3) * ch1_dim2 << 1) + 2] = cc1[(m1
			+ (ki + j * cc1_dim3) * cc1_dim2 << 1) + 2] + cc1[(m1
			+ (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 2];
		ch1[(m2 + (ki + jc * ch1_dim3) * ch1_dim2 << 1) + 2] = cc1[(
			m1 + (ki + j * cc1_dim3) * cc1_dim2 << 1) + 2] - cc1[(
			m1 + (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 2];
/* L112: */
	    }
	}
/* L111: */
    }
    i__3 = ipph;
    for (j = 2; j <= i__3; ++j) {
	i__4 = *lid;
	for (ki = 1; ki <= i__4; ++ki) {
	    m2 = m2s;
	    i__1 = m1d;
	    i__2 = *im1;
	    for (m1 = 1; i__2 < 0 ? m1 >= i__1 : m1 <= i__1; m1 += i__2) {
		m2 += *im2;
		cc1[(m1 + (ki + cc1_dim3) * cc1_dim2 << 1) + 1] += ch1[(m2 + (
			ki + j * ch1_dim3) * ch1_dim2 << 1) + 1];
		cc1[(m1 + (ki + cc1_dim3) * cc1_dim2 << 1) + 2] += ch1[(m2 + (
			ki + j * ch1_dim3) * ch1_dim2 << 1) + 2];
/* L117: */
	    }
	}
/* L118: */
    }
    i__3 = ipph;
    for (l = 2; l <= i__3; ++l) {
	lc = ipp2 - l;
	i__2 = *lid;
	for (ki = 1; ki <= i__2; ++ki) {
	    m2 = m2s;
	    i__1 = m1d;
	    i__4 = *im1;
	    for (m1 = 1; i__4 < 0 ? m1 >= i__1 : m1 <= i__1; m1 += i__4) {
		m2 += *im2;
		cc1[(m1 + (ki + l * cc1_dim3) * cc1_dim2 << 1) + 1] = ch1[(m2
			+ (ki + ch1_dim3) * ch1_dim2 << 1) + 1] + wa[(l - 1 +
			wa_dim2) * wa_dim1 + 1] * ch1[(m2 + (ki + (ch1_dim3 <<
			 1)) * ch1_dim2 << 1) + 1];
		cc1[(m1 + (ki + lc * cc1_dim3) * cc1_dim2 << 1) + 1] = wa[(l
			- 1 + (wa_dim2 << 1)) * wa_dim1 + 1] * ch1[(m2 + (ki
			+ *ip * ch1_dim3) * ch1_dim2 << 1) + 1];
		cc1[(m1 + (ki + l * cc1_dim3) * cc1_dim2 << 1) + 2] = ch1[(m2
			+ (ki + ch1_dim3) * ch1_dim2 << 1) + 2] + wa[(l - 1 +
			wa_dim2) * wa_dim1 + 1] * ch1[(m2 + (ki + (ch1_dim3 <<
			 1)) * ch1_dim2 << 1) + 2];
		cc1[(m1 + (ki + lc * cc1_dim3) * cc1_dim2 << 1) + 2] = wa[(l
			- 1 + (wa_dim2 << 1)) * wa_dim1 + 1] * ch1[(m2 + (ki
			+ *ip * ch1_dim3) * ch1_dim2 << 1) + 2];
/* L113: */
	    }
	}
	i__4 = ipph;
	for (j = 3; j <= i__4; ++j) {
	    jc = ipp2 - j;
	    idlj = (l - 1) * (j - 1) % *ip;
	    war = wa[(idlj + wa_dim2) * wa_dim1 + 1];
	    wai = wa[(idlj + (wa_dim2 << 1)) * wa_dim1 + 1];
	    i__1 = *lid;
	    for (ki = 1; ki <= i__1; ++ki) {
		m2 = m2s;
		i__2 = m1d;
		i__5 = *im1;
		for (m1 = 1; i__5 < 0 ? m1 >= i__2 : m1 <= i__2; m1 += i__5) {
		    m2 += *im2;
		    cc1[(m1 + (ki + l * cc1_dim3) * cc1_dim2 << 1) + 1] +=
			    war * ch1[(m2 + (ki + j * ch1_dim3) * ch1_dim2 <<
			    1) + 1];
		    cc1[(m1 + (ki + lc * cc1_dim3) * cc1_dim2 << 1) + 1] +=
			    wai * ch1[(m2 + (ki + jc * ch1_dim3) * ch1_dim2 <<
			     1) + 1];
		    cc1[(m1 + (ki + l * cc1_dim3) * cc1_dim2 << 1) + 2] +=
			    war * ch1[(m2 + (ki + j * ch1_dim3) * ch1_dim2 <<
			    1) + 2];
		    cc1[(m1 + (ki + lc * cc1_dim3) * cc1_dim2 << 1) + 2] +=
			    wai * ch1[(m2 + (ki + jc * ch1_dim3) * ch1_dim2 <<
			     1) + 2];
/* L114: */
		}
	    }
/* L115: */
	}
/* L116: */
    }
    if (*ido > 1 || *na == 1) {
	goto L136;
    }
    i__3 = ipph;
    for (j = 2; j <= i__3; ++j) {
	jc = ipp2 - j;
	i__4 = *lid;
	for (ki = 1; ki <= i__4; ++ki) {
	    i__5 = m1d;
	    i__2 = *im1;
	    for (m1 = 1; i__2 < 0 ? m1 >= i__5 : m1 <= i__5; m1 += i__2) {
		chold1 = cc1[(m1 + (ki + j * cc1_dim3) * cc1_dim2 << 1) + 1]
			- cc1[(m1 + (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 2]
			;
		chold2 = cc1[(m1 + (ki + j * cc1_dim3) * cc1_dim2 << 1) + 1]
			+ cc1[(m1 + (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 2]
			;
		cc1[(m1 + (ki + j * cc1_dim3) * cc1_dim2 << 1) + 1] = chold1;
		cc1[(m1 + (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 2] = cc1[(
			m1 + (ki + j * cc1_dim3) * cc1_dim2 << 1) + 2] - cc1[(
			m1 + (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 1];
		cc1[(m1 + (ki + j * cc1_dim3) * cc1_dim2 << 1) + 2] += cc1[(
			m1 + (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 1];
		cc1[(m1 + (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 1] = chold2;
/* L119: */
	    }
	}
/* L120: */
    }
    return 0;
L136:
    i__3 = *lid;
    for (ki = 1; ki <= i__3; ++ki) {
	m2 = m2s;
	i__2 = m1d;
	i__5 = *im1;
	for (m1 = 1; i__5 < 0 ? m1 >= i__2 : m1 <= i__2; m1 += i__5) {
	    m2 += *im2;
	    ch1[(m2 + (ki + ch1_dim3) * ch1_dim2 << 1) + 1] = cc1[(m1 + (ki +
		    cc1_dim3) * cc1_dim2 << 1) + 1];
	    ch1[(m2 + (ki + ch1_dim3) * ch1_dim2 << 1) + 2] = cc1[(m1 + (ki +
		    cc1_dim3) * cc1_dim2 << 1) + 2];
/* L137: */
	}
    }
    i__5 = ipph;
    for (j = 2; j <= i__5; ++j) {
	jc = ipp2 - j;
	i__2 = *lid;
	for (ki = 1; ki <= i__2; ++ki) {
	    m2 = m2s;
	    i__3 = m1d;
	    i__4 = *im1;
	    for (m1 = 1; i__4 < 0 ? m1 >= i__3 : m1 <= i__3; m1 += i__4) {
		m2 += *im2;
		ch1[(m2 + (ki + j * ch1_dim3) * ch1_dim2 << 1) + 1] = cc1[(m1
			+ (ki + j * cc1_dim3) * cc1_dim2 << 1) + 1] - cc1[(m1
			+ (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 2];
		ch1[(m2 + (ki + jc * ch1_dim3) * ch1_dim2 << 1) + 1] = cc1[(
			m1 + (ki + j * cc1_dim3) * cc1_dim2 << 1) + 1] + cc1[(
			m1 + (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 2];
		ch1[(m2 + (ki + jc * ch1_dim3) * ch1_dim2 << 1) + 2] = cc1[(
			m1 + (ki + j * cc1_dim3) * cc1_dim2 << 1) + 2] - cc1[(
			m1 + (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 1];
		ch1[(m2 + (ki + j * ch1_dim3) * ch1_dim2 << 1) + 2] = cc1[(m1
			+ (ki + j * cc1_dim3) * cc1_dim2 << 1) + 2] + cc1[(m1
			+ (ki + jc * cc1_dim3) * cc1_dim2 << 1) + 1];
/* L134: */
	    }
	}
/* L135: */
    }
    if (*ido == 1) {
	return 0;
    }
    i__5 = *ido;
    for (i__ = 1; i__ <= i__5; ++i__) {
	i__4 = *l1;
	for (k = 1; k <= i__4; ++k) {
	    m2 = m2s;
	    i__3 = m1d;
	    i__2 = *im1;
	    for (m1 = 1; i__2 < 0 ? m1 >= i__3 : m1 <= i__3; m1 += i__2) {
		m2 += *im2;
		cc[(m1 + (k + (i__ * cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1)
			+ 1] = ch[(m2 + (k + (i__ + ch_dim4) * ch_dim3) *
			ch_dim2 << 1) + 1];
		cc[(m1 + (k + (i__ * cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1)
			+ 2] = ch[(m2 + (k + (i__ + ch_dim4) * ch_dim3) *
			ch_dim2 << 1) + 2];
/* L130: */
	    }
	}
/* L131: */
    }
    i__5 = *ip;
    for (j = 2; j <= i__5; ++j) {
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    m2 = m2s;
	    i__3 = m1d;
	    i__4 = *im1;
	    for (m1 = 1; i__4 < 0 ? m1 >= i__3 : m1 <= i__3; m1 += i__4) {
		m2 += *im2;
		cc[(m1 + (k + (j + cc_dim4) * cc_dim3) * cc_dim2 << 1) + 1] =
			ch[(m2 + (k + (j * ch_dim4 + 1) * ch_dim3) * ch_dim2
			<< 1) + 1];
		cc[(m1 + (k + (j + cc_dim4) * cc_dim3) * cc_dim2 << 1) + 2] =
			ch[(m2 + (k + (j * ch_dim4 + 1) * ch_dim3) * ch_dim2
			<< 1) + 2];
/* L122: */
	    }
	}
/* L123: */
    }
    i__5 = *ip;
    for (j = 2; j <= i__5; ++j) {
	i__4 = *ido;
	for (i__ = 2; i__ <= i__4; ++i__) {
	    i__3 = *l1;
	    for (k = 1; k <= i__3; ++k) {
		m2 = m2s;
		i__2 = m1d;
		i__1 = *im1;
		for (m1 = 1; i__1 < 0 ? m1 >= i__2 : m1 <= i__2; m1 += i__1) {
		    m2 += *im2;
		    cc[(m1 + (k + (j + i__ * cc_dim4) * cc_dim3) * cc_dim2 <<
			    1) + 1] = wa[i__ + (j - 1 + wa_dim2) * wa_dim1] *
			    ch[(m2 + (k + (i__ + j * ch_dim4) * ch_dim3) *
			    ch_dim2 << 1) + 1] - wa[i__ + (j - 1 + (wa_dim2 <<
			     1)) * wa_dim1] * ch[(m2 + (k + (i__ + j *
			    ch_dim4) * ch_dim3) * ch_dim2 << 1) + 2];
		    cc[(m1 + (k + (j + i__ * cc_dim4) * cc_dim3) * cc_dim2 <<
			    1) + 2] = wa[i__ + (j - 1 + wa_dim2) * wa_dim1] *
			    ch[(m2 + (k + (i__ + j * ch_dim4) * ch_dim3) *
			    ch_dim2 << 1) + 2] + wa[i__ + (j - 1 + (wa_dim2 <<
			     1)) * wa_dim1] * ch[(m2 + (k + (i__ + j *
			    ch_dim4) * ch_dim3) * ch_dim2 << 1) + 1];
/* L124: */
		}
	    }
/* L125: */
	}
/* L126: */
    }
    return 0;
}